

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O3

double FindMaxElevation(CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *aos,DateTime *los)

{
  DateTime DVar1;
  long lVar2;
  int64_t ticks;
  CoordTopocentric topo;
  Observer obs;
  Eci eci;
  double local_110;
  DateTime local_108;
  double local_100;
  CoordTopocentric local_f8;
  Observer local_d8;
  Eci local_78;
  
  libsgp4::Observer::Observer(&local_d8,user_geo);
  local_108 = (DateTime)aos->m_encoded;
  local_110 = ((double)(los->m_encoded - local_108.m_encoded) / 1000000.0) / 9.0;
  lVar2 = los->m_encoded;
  do {
    local_100 = -99999999999999.0;
    DVar1.m_encoded = local_108.m_encoded;
    if (local_108.m_encoded < lVar2) {
      local_100 = -99999999999999.0;
      do {
        libsgp4::SGP4::FindPosition(&local_78,sgp4,&local_108);
        libsgp4::Observer::GetLookAngle(&local_f8,&local_d8,&local_78);
        DVar1.m_encoded = local_108.m_encoded;
        if (local_f8.elevation <= local_100) break;
        local_108.m_encoded = local_108.m_encoded + (long)(local_110 * 1000000.0);
        DVar1.m_encoded = lVar2;
        local_100 = local_f8.elevation;
      } while (local_108.m_encoded < lVar2);
    }
    lVar2 = (long)(local_110 * -2.0 * 1000000.0);
    local_108.m_encoded = DVar1.m_encoded + lVar2;
    local_110 = ((double)-lVar2 / 1000000.0) / 9.0;
    lVar2 = DVar1.m_encoded;
    if (local_110 <= 1.0) {
      return local_100;
    }
  } while( true );
}

Assistant:

double FindMaxElevation(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& aos,
        const libsgp4::DateTime& los)
{
    libsgp4::Observer obs(user_geo);

    bool running;

    double time_step = (los - aos).TotalSeconds() / 9.0;
    libsgp4::DateTime current_time(aos); //! current time
    libsgp4::DateTime time1(aos); //! start time of search period
    libsgp4::DateTime time2(los); //! end time of search period
    double max_elevation; //! max elevation

    running = true;

    do
    {
        running = true;
        max_elevation = -99999999999999.0;
        while (running && current_time < time2)
        {
            /*
             * find position
             */
            libsgp4::Eci eci = sgp4.FindPosition(current_time);
            libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

            if (topo.elevation > max_elevation)
            {
                /*
                 * still going up
                 */
                max_elevation = topo.elevation;
                /*
                 * move time along
                 */
                current_time = current_time.AddSeconds(time_step);
                if (current_time > time2)
                {
                    /*
                     * dont go past end time
                     */
                    current_time = time2;
                }
            }
            else
            {
                /*
                 * stop
                 */
                running = false;
            }
        }

        /*
         * make start time to 2 time steps back
         */
        time1 = current_time.AddSeconds(-2.0 * time_step);
        /*
         * make end time to current time
         */
        time2 = current_time;
        /*
         * current time to start time
         */
        current_time = time1;
        /*
         * recalculate time step
         */
        time_step = (time2 - time1).TotalSeconds() / 9.0;
    }
    while (time_step > 1.0);

    return max_elevation;
}